

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64CreateDirect(void)

{
  bool expval;
  Offset<RootTable> root;
  uint *puVar1;
  ulong uVar2;
  int *piVar3;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  FlatBufferBuilder64 fbb;
  allocator_type local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  FlatBufferBuilder64 local_d0;
  VerifierTemplate<false> local_50;
  
  local_d0.buf_.allocator_ = (Allocator *)0x0;
  local_d0.buf_.own_allocator_ = false;
  local_d0.buf_.initial_size_ = 0x400;
  local_d0.buf_.max_size_ = 0x7fffffffffffffff;
  local_d0.buf_.buffer_minalign_ = 8;
  local_d0.length_of_64_bit_region_ = 0;
  local_d0.nested = false;
  local_d0.finished = false;
  local_d0.buf_.reserved_ = 0;
  local_d0.buf_.size_ = 0;
  local_d0.buf_.buf_ = (uint8_t *)0x0;
  local_d0.buf_.cur_._0_6_ = 0;
  local_d0.buf_.cur_._6_2_ = 0;
  local_d0.buf_.scratch_._0_6_ = 0;
  local_d0._78_8_ = 0;
  local_d0.minalign_ = 1;
  local_d0.force_defaults_ = false;
  local_d0.dedup_vtables_ = true;
  local_d0.string_pool = (StringOffsetMap *)0x0;
  local_50.buf_ = (uint8_t *)CONCAT53(local_50.buf_._3_5_,0x20100);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e8,__l,&local_e9);
  root = CreateRootTableDirect
                   (&local_d0,&local_e8,0,"some far string",&local_e8,"some near string",
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  FlatBufferBuilderImpl<true>::Finish(&local_d0,root.o,(char *)0x0,false);
  local_50.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_d0);
  local_50.size_ = local_d0.buf_.size_;
  local_50.opts_.max_depth = 0x40;
  local_50.opts_.max_tables = 1000000;
  local_50.opts_.check_alignment = true;
  local_50.opts_.check_nested_flatbuffers = true;
  local_50.opts_.max_size = 0x7fffffffffffffff;
  local_50.opts_.assert = true;
  local_50.upper_bound_ = 0;
  local_50.depth_ = 0;
  local_50.num_tables_ = 0;
  local_50.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (local_d0.buf_.size_ < 0x7fffffffffffffff) {
    expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_50,(char *)0x0,0);
    TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,199,"");
    puVar1 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_d0);
    if (puVar1 == (uint *)0x0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)((ulong)*puVar1 + (long)puVar1);
    }
    uVar2 = (ulong)*(ushort *)((long)piVar3 + (4 - (long)*piVar3));
    TestEq<unsigned_int,unsigned_long>
              (*(uint *)((long)piVar3 + *(long *)((long)piVar3 + uVar2) + uVar2),
               (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               "\'root_table->far_vector()->size()\' != \'data.size()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0xcb,"");
    uVar2 = (ulong)*(ushort *)((long)piVar3 + (10 - (long)*piVar3));
    TestEq<unsigned_long,unsigned_long>
              (*(unsigned_long *)((long)piVar3 + *(long *)((long)piVar3 + uVar2) + uVar2),
               (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               "\'root_table->big_vector()->size()\' != \'data.size()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0xcc,"");
    uVar2 = (ulong)*(ushort *)((long)piVar3 + (8 - (long)*piVar3));
    TestEqStr((char *)((long)piVar3 + *(long *)((long)piVar3 + uVar2) + uVar2 + 4),"some far string"
              ,"\'root_table->far_string()->c_str()\' != \'\"some far string\"\'",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xcd,"");
    uVar2 = (ulong)*(ushort *)((long)piVar3 + (0xc - (long)*piVar3));
    TestEqStr((char *)((long)piVar3 + *(uint *)((long)piVar3 + uVar2) + uVar2 + 4),
              "some near string",
              "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xce,"");
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_d0);
    return;
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void Offset64CreateDirect() {
  FlatBufferBuilder64 fbb;

  // Create a vector of some data
  std::vector<uint8_t> data{ 0, 1, 2 };

  // Call the "Direct" creation method to ensure that things are added to the
  // buffer in the correct order, Offset64 first followed by any Offsets.
  const Offset<RootTable> root_table_offset = CreateRootTableDirect(
      fbb, &data, 0, "some far string", &data, "some near string");

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

  TEST_EQ(VerifyRootTableBuffer(verifier), true);

  // Verify the data.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ(root_table->far_vector()->size(), data.size());
  TEST_EQ(root_table->big_vector()->size(), data.size());
  TEST_EQ_STR(root_table->far_string()->c_str(), "some far string");
  TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
}